

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::Read(TPZSkylMatrix<double> *this,TPZStream *buf,void *context)

{
  double *pdVar1;
  long lVar2;
  int64_t i;
  long lVar3;
  double *pdVar4;
  TPZVec<long> skyl;
  long local_40;
  TPZVec<long> local_38;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZStream::Read<double>(buf,&this->fStorage);
  local_40 = 0;
  TPZVec<long>::TPZVec
            (&local_38,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1,&local_40);
  TPZStream::Read<long>(buf,&local_38);
  pdVar1 = (double *)(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  pdVar4 = pdVar1;
  if (pdVar1 != (double *)0x0) {
    pdVar4 = (this->fStorage).fStore;
  }
  TPZVec<double_*>::Resize(&this->fElem,(long)pdVar1 + 1);
  lVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  for (lVar3 = 0; lVar3 <= lVar2; lVar3 = lVar3 + 1) {
    (this->fElem).fStore[lVar3] = pdVar4 + local_38.fStore[lVar3];
  }
  TPZVec<long>::~TPZVec(&local_38);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf, context);
    buf.Read( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    buf.Read( skyl);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    fElem.Resize(this->Rows()+1);
    for (int64_t i=0; i<this->Rows()+1; i++) {
        fElem[i] = skyl[i] + ptr;
    }
}